

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

stb_uint stb_decompress(stb_uchar *output,stb_uchar *i,stb_uint length)

{
  uchar *puVar1;
  byte bVar2;
  stb_uint sVar3;
  ushort *puVar4;
  stb_uint sVar5;
  uint uVar6;
  ulong uVar7;
  ushort *puVar8;
  uint uVar9;
  bool bVar10;
  
  uVar9 = *(uint *)i;
  sVar5 = 0;
  if (((uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18) ==
       0x57bc0000) &&
     (uVar9 = *(uint *)(i + 4), sVar5 = 0,
     ((uVar9 >> 0x18 == 0 && (uVar9 & 0xff0000) == 0) && (uVar9 & 0xff00) == 0) &&
     (uVar9 & 0xff) == 0)) {
    uVar9 = *(uint *)(i + 8);
    uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    stb__barrier3 = i + length;
    puVar1 = output + uVar9;
    puVar4 = (ushort *)(i + 0x10);
    sVar5 = 0;
    stb__barrier2 = i;
    stb__barrier = puVar1;
    stb__barrier4 = output;
    stb__dout = output;
    do {
      bVar2 = (byte)*puVar4;
      uVar6 = (uint)bVar2;
      if (bVar2 < 0x20) {
        if (bVar2 < 0x18) {
          if (bVar2 < 0x10) {
            if (bVar2 < 8) {
              if (bVar2 == 4) {
                stb__match(stb__dout +
                           ~((ulong)*(byte *)((long)puVar4 + 3) |
                             (ulong)*(byte *)((long)puVar4 + 1) << 0x10 |
                            (ulong)(byte)puVar4[1] << 8),
                           (ushort)(puVar4[2] << 8 | puVar4[2] >> 8) + 1);
                puVar8 = puVar4 + 3;
              }
              else {
                if (uVar6 == 6) {
                  uVar7 = ~((ulong)*(byte *)((long)puVar4 + 3) |
                            (ulong)*(byte *)((long)puVar4 + 1) << 0x10 | (ulong)(byte)puVar4[1] << 8
                           );
                  uVar6 = (uint)(byte)puVar4[2];
                  goto LAB_0018d190;
                }
                puVar8 = puVar4;
                if (uVar6 == 7) {
                  stb__lit((byte *)((long)puVar4 + 3),
                           (ushort)(*(ushort *)((long)puVar4 + 1) << 8 |
                                   *(ushort *)((long)puVar4 + 1) >> 8) + 1);
                  puVar8 = (ushort *)
                           ((long)puVar4 +
                           (ulong)(ushort)(*(ushort *)((long)puVar4 + 1) << 8 |
                                          *(ushort *)((long)puVar4 + 1) >> 8) + 4);
                }
              }
            }
            else {
              stb__lit((stb_uchar *)(puVar4 + 1),
                       ((uint)bVar2 * 0x100 + (uint)*(byte *)((long)puVar4 + 1)) - 0x7ff);
              puVar8 = (ushort *)
                       ((long)puVar4 + ((ulong)(ushort)(*puVar4 << 8 | *puVar4 >> 8) - 0x7fd));
            }
          }
          else {
            uVar7 = -(ulong)(((uint)*(byte *)((long)puVar4 + 1) * 0x100 +
                             ((uint)(byte)puVar4[1] | (uint)bVar2 << 0x10)) - 0xfffff);
            uVar6 = (uint)(ushort)(*(ushort *)((long)puVar4 + 3) << 8 |
                                  *(ushort *)((long)puVar4 + 3) >> 8);
LAB_0018d190:
            stb__match(stb__dout + uVar7,uVar6 + 1);
            puVar8 = (ushort *)((long)puVar4 + 5);
          }
        }
        else {
          stb__match(stb__dout +
                     -(ulong)(((uint)*(byte *)((long)puVar4 + 1) * 0x100 +
                              ((uint)(byte)puVar4[1] | (uint)bVar2 << 0x10)) - 0x17ffff),
                     *(byte *)((long)puVar4 + 3) + 1);
          puVar8 = puVar4 + 2;
        }
      }
      else if ((char)bVar2 < '\0') {
        stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar4 + 1),uVar6 - 0x7f);
        puVar8 = puVar4 + 1;
      }
      else if (bVar2 < 0x40) {
        stb__lit((byte *)((long)puVar4 + 1),uVar6 - 0x1f);
        puVar8 = (ushort *)((long)puVar4 + ((ulong)(byte)*puVar4 - 0x1e));
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar4 + 1) + (uint)bVar2 * 0x100) - 0x3fff),
                   (byte)puVar4[1] + 1);
        puVar8 = (ushort *)((long)puVar4 + 3);
      }
      if (puVar8 == puVar4) {
        if (((byte)*puVar8 != 5) || (*(byte *)((long)puVar8 + 1) != 0xfa)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0x27fb,"stb_uint stb_decompress(stb_uchar *, stb_uchar *, stb_uint)");
        }
        if (stb__dout != puVar1) {
          __assert_fail("stb__dout == output + olen",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0x27f5,"stb_uint stb_decompress(stb_uchar *, stb_uchar *, stb_uint)");
        }
        sVar3 = stb_adler32(1,output,uVar9);
        uVar6 = *(uint *)(puVar8 + 1);
        sVar5 = 0;
        if (sVar3 == (uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                     uVar6 << 0x18)) {
          sVar5 = uVar9;
        }
      }
      else if (puVar1 < stb__dout) {
        __assert_fail("stb__dout <= output + olen",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0x27ff,"stb_uint stb_decompress(stb_uchar *, stb_uchar *, stb_uint)");
      }
      bVar10 = puVar8 != puVar4;
      puVar4 = puVar8;
    } while (bVar10);
  }
  return sVar5;
}

Assistant:

stb_uint stb_decompress(stb_uchar *output, stb_uchar *i, stb_uint length)
{
   stb_uint olen;
   if (stb__in4(0) != 0x57bC0000) return 0;
   if (stb__in4(4) != 0)          return 0; // error! stream is > 4GB
   olen = stb_decompress_length(i);
   stb__barrier2 = i;
   stb__barrier3 = i+length;
   stb__barrier = output + olen;
   stb__barrier4 = output;
   i += 16;

   stb__dout = output;
   while (1) {
      stb_uchar *old_i = i;
      i = stb_decompress_token(i);
      if (i == old_i) {
         if (*i == 0x05 && i[1] == 0xfa) {
            assert(stb__dout == output + olen);
            if (stb__dout != output + olen) return 0;
            if (stb_adler32(1, output, olen) != (stb_uint) stb__in4(2))
               return 0;
            return olen;
         } else {
            assert(0); /* NOTREACHED */
            return 0;
         }
      }
      assert(stb__dout <= output + olen); 
      if (stb__dout > output + olen)
         return 0;
   }
}